

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,double kappa,double delta,double theta)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  _Head_base<0UL,_double_*,_false> _Var6;
  _Head_base<0UL,_int_*,_false> _Var7;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  double *pdVar8;
  undefined8 uVar9;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> _Var10;
  uint uVar11;
  bool bVar12;
  uint uVar13;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_false>
  _Var15;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
  _Var16;
  rc_data *prVar17;
  undefined8 extraout_RAX;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  _Head_base<0UL,_int_*,_false> _Var22;
  long lVar23;
  int *piVar24;
  type it;
  long lVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 in_XMM4_Qb;
  int local_b4;
  undefined1 local_88 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_78;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
  *local_70;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_68;
  double local_60;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_50;
  long local_48;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  _Var14._M_current = (first->current)._M_current;
  if (_Var14._M_current != (last->current)._M_current) {
    local_68._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )((long)this + 8);
    dVar29 = kappa / (1.0 - kappa);
    local_70 = (solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                *)this;
    local_60 = theta;
    local_58._M_head_impl = (col_value *)first;
    local_50 = last;
    do {
      _Var22._M_head_impl = (int *)(long)_Var14._M_current[-1];
      if (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
            *)this)->m <= _Var14._M_current[-1]) {
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        goto LAB_0018fe04;
      }
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_88,
                 (int)local_68._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                      _M_head_impl);
      uVar20 = 0;
      local_b4 = 0;
      local_78._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)_Var22._M_head_impl;
      if (local_88._8_8_ != local_88._0_8_) {
        _Var6._M_head_impl =
             (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
        _Var22._M_head_impl = (int *)local_88._8_8_;
        do {
          iVar21 = *_Var22._M_head_impl;
          _Var22._M_head_impl = _Var22._M_head_impl + 8;
          _Var6._M_head_impl[iVar21] = local_60 * _Var6._M_head_impl[iVar21];
        } while (_Var22._M_head_impl != (int *)local_88._0_8_);
        uVar20 = 0;
        if (local_88._8_8_ != local_88._0_8_) {
          uVar20 = 0;
          _Var22._M_head_impl = (int *)local_88._8_8_;
          uVar11 = 1;
          do {
            uVar13 = uVar11;
            uVar19 = uVar20;
            sparse_matrix<int>::column
                      ((sparse_matrix<int> *)&local_40,
                       (int)local_68._M_t.
                            super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                            .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                            ._M_head_impl);
            _Var7._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
            if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl
                == (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                   local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl) {
              dVar30 = 0.0;
            }
            else {
              auVar31 = ZEXT816(0);
              do {
                iVar21 = *local_38._M_head_impl;
                local_38._M_head_impl = local_38._M_head_impl + 2;
                auVar36._0_8_ = (double)_Var7._M_head_impl[iVar21];
                auVar36._8_8_ = in_XMM4_Qb;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                                  *)this)->P)._M_t.
                               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                               super__Head_base<0UL,_double_*,_false>._M_head_impl[iVar21];
                auVar31 = vfmadd231sd_fma(auVar31,auVar36,auVar2);
                dVar30 = auVar31._0_8_;
              } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                       local_38._M_head_impl !=
                       (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                       local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl);
            }
            _Var16._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
                 ._M_head_impl;
            _Var16._M_head_impl[uVar19].id = (int)uVar19;
            iVar21 = *_Var22._M_head_impl;
            _Var22._M_head_impl = _Var22._M_head_impl + 2;
            _Var16._M_head_impl[uVar19].a = _Var7._M_head_impl[iVar21];
            _Var16._M_head_impl[uVar19].value =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->c->linear_elements)._M_t.
                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl[*(int *)(local_88._8_8_ + 4)] -
                 dVar30;
            uVar20 = uVar19 + 1;
            uVar11 = uVar13 + 1;
          } while (_Var22._M_head_impl != (int *)local_88._0_8_);
          if (uVar19 != 0) {
            __g = ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->rng;
            std::
            __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var16._M_head_impl,_Var16._M_head_impl + (uVar20 & 0xffffffff),
                       (int)LZCOUNT(uVar20 & 0xffffffff) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var16._M_head_impl,_Var16._M_head_impl + (uVar20 & 0xffffffff));
            prVar17 = _Var16._M_head_impl + 1;
            lVar27 = (ulong)uVar13 * 0x10 + -0x10;
            do {
              if (((_Var16._M_head_impl)->value != prVar17->value) ||
                 (NAN((_Var16._M_head_impl)->value) || NAN(prVar17->value))) {
                std::
                shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                          (_Var16._M_head_impl,prVar17,__g);
                _Var16._M_head_impl = prVar17;
              }
              prVar17 = prVar17 + 1;
              lVar27 = lVar27 + -0x10;
            } while (lVar27 != 0);
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (_Var16._M_head_impl,prVar17,__g);
          }
        }
      }
      _Var10._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)local_78;
      _Var15._M_head_impl =
           (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
              *)this)->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_false>
           ._M_head_impl;
      iVar21 = (int)uVar20;
      if (_Var15._M_head_impl
          [(long)local_78._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl].min < 1) {
        lVar27 = 0xffffffff;
LAB_0018fbf4:
        iVar5 = (int)lVar27;
        iVar18 = iVar5 + 1;
        if ((iVar18 < iVar21) &&
           (local_b4 <=
            _Var15._M_head_impl
            [(long)_Var10._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl].max)) {
          _Var16._M_head_impl =
               (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                  *)this)->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
               ._M_head_impl;
          lVar23 = (long)iVar5 << 4;
          lVar26 = (long)iVar5 + 1;
          do {
            lVar27 = lVar26;
            _Var15._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_false>
                 ._M_head_impl;
            local_b4 = local_b4 + *(int *)((long)&_Var16._M_head_impl[1].a + lVar23);
            if (local_b4 <
                _Var15._M_head_impl
                [(long)_Var10._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl].min) {
              piVar24 = (int *)(local_88._8_8_ +
                               (long)*(int *)((long)&_Var16._M_head_impl[1].id + lVar23) * 2 * 4);
LAB_0018fcf2:
              bit_array_impl::unset(&x->super_bit_array_impl,piVar24[1]);
              _Var6._M_head_impl =
                   (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                      *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                   ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = dVar29;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = delta;
              auVar34._8_8_ = 0;
              auVar34._0_8_ =
                   *(double *)
                    ((long)((((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                               *)this)->R)._M_t.
                            super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                            .
                            super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
                            ._M_head_impl + 1) + lVar23) * 0.5;
              auVar31 = vfmadd213sd_fma(auVar34,auVar39,auVar4);
              _Var6._M_head_impl[*piVar24] = _Var6._M_head_impl[*piVar24] - auVar31._0_8_;
              break;
            }
            piVar24 = (int *)(local_88._8_8_ +
                             (long)*(int *)((long)&_Var16._M_head_impl[1].id + lVar23) * 2 * 4);
            if (*(int *)((long)(_Var15._M_head_impl +
                               (long)_Var10._M_t.
                                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                     super__Head_base<0UL,_int_*,_false>._M_head_impl) + 4) <
                local_b4) goto LAB_0018fcf2;
            dVar30 = *(double *)((long)&_Var16._M_head_impl[1].value + lVar23);
            bVar12 = dVar30 == 0.0;
            bVar28 = dVar30 < 0.0;
            if ((bVar12) && (!NAN(dVar30))) {
              dVar30 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                                    *)this)->rng);
              bVar12 = dVar30 == 0.5;
              bVar28 = 0.5 < dVar30;
            }
            if (bVar28 || bVar12) goto LAB_0018fcf2;
            bit_array_impl::set(&x->super_bit_array_impl,piVar24[1]);
            _Var16._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
                 ._M_head_impl;
            _Var6._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = dVar29;
            pdVar1 = (double *)((long)&_Var16._M_head_impl[1].value + lVar23);
            lVar23 = lVar23 + 0x10;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = delta;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = *pdVar1 * 0.5;
            auVar31 = vfmadd213sd_fma(auVar33,auVar38,auVar3);
            _Var6._M_head_impl[*piVar24] = auVar31._0_8_ + _Var6._M_head_impl[*piVar24];
            lVar26 = lVar27 + 1;
          } while (lVar27 + 1 < (long)iVar21);
          iVar18 = (int)lVar27 + 1;
        }
      }
      else {
        _Var16._M_head_impl =
             (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                *)this)->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
             ._M_head_impl;
        lVar23 = 0;
        local_48 = (long)iVar21 + -2;
        local_b4 = 0;
        lVar26 = -1;
        do {
          uVar9 = local_88._8_8_;
          lVar25 = (long)*(int *)((long)&(_Var16._M_head_impl)->id + lVar23);
          local_b4 = local_b4 + *(int *)((long)&(_Var16._M_head_impl)->a + lVar23);
          lVar27 = lVar26 + 1;
          iVar5 = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                     *)this)->b)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_false>
                  ._M_head_impl
                  [(long)_Var10._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl].min;
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_88._8_8_ + (lVar25 * 2 + 1) * 4));
          auVar37._8_8_ = 0;
          auVar37._0_8_ = dVar29;
          _Var16._M_head_impl =
               (local_70->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
               ._M_head_impl;
          _Var6._M_head_impl =
               (local_70->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
               .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = delta;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(double *)((long)&(_Var16._M_head_impl)->value + lVar23) * 0.5;
          auVar31 = vfmadd213sd_fma(auVar32,auVar37,auVar31);
          _Var6._M_head_impl[*(int *)(uVar9 + lVar25 * 2 * 4)] =
               auVar31._0_8_ + _Var6._M_head_impl[*(int *)(uVar9 + lVar25 * 2 * 4)];
          this = (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
                  *)local_70;
          if (iVar5 <= local_b4) break;
          lVar23 = lVar23 + 0x10;
          bVar12 = lVar26 < local_48;
          lVar26 = lVar27;
        } while (bVar12);
        _Var15._M_head_impl =
             (local_70->b)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_false>
             ._M_head_impl;
        if (_Var15._M_head_impl
            [(long)_Var10._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl].min <= local_b4)
        goto LAB_0018fbf4;
        iVar18 = (int)lVar27 + 1;
      }
      this = (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
              *)local_70;
      if (iVar18 < iVar21) {
        prVar17 = (local_70->R)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
                  ._M_head_impl;
        lVar26 = (long)(int)(uint)lVar27 << 4;
        iVar21 = ~(uint)lVar27 + iVar21;
        do {
          uVar9 = local_88._8_8_;
          lVar27 = (long)*(int *)((long)&prVar17[1].id + lVar26);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_88._8_8_ + (lVar27 * 2 + 1) * 4));
          prVar17 = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                       *)this)->R)._M_t.
                    super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                    .
                    super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
                    ._M_head_impl;
          pdVar8 = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                      *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                   ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = dVar29;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = delta;
          pdVar1 = (double *)((long)&prVar17[1].value + lVar26);
          lVar26 = lVar26 + 0x10;
          iVar21 = iVar21 + -1;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *pdVar1 * 0.5;
          auVar31 = vfmadd213sd_fma(auVar35,auVar41,auVar40);
          pdVar8[*(int *)(uVar9 + lVar27 * 2 * 4)] =
               pdVar8[*(int *)(uVar9 + lVar27 * 2 * 4)] - auVar31._0_8_;
        } while (iVar21 != 0);
      }
      bVar12 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,baryonyx::bit_array>
                         ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                           *)this,(int)local_78._M_t.
                                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                       super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      if (!bVar12) {
LAB_0018fe04:
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      _Var14._M_current = *(int **)local_58._M_head_impl + -1;
      *local_58._M_head_impl = (col_value)_Var14._M_current;
    } while (_Var14._M_current != (local_50->current)._M_current);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }